

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O0

bool __thiscall
cmConditionEvaluator::HandleLevel4
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *errorString,
          MessageType *status)

{
  bool bVar1;
  reference pcVar2;
  bool local_7c;
  bool local_7b;
  bool local_7a;
  bool local_79;
  _Self local_70;
  _Self local_68;
  _Self local_60;
  _Self local_58;
  _Self local_50;
  _List_iterator<cmExpandedCommandArgument> local_48;
  iterator argP2;
  iterator argP1;
  iterator arg;
  bool rhs;
  bool lhs;
  int reducible;
  MessageType *status_local;
  string *errorString_local;
  cmArgumentList *newArgs_local;
  cmConditionEvaluator *this_local;
  
  do {
    arg._M_node._4_4_ = 0;
    argP1 = std::__cxx11::
            list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::begin
                      (newArgs);
    std::_List_iterator<cmExpandedCommandArgument>::_List_iterator(&argP2);
    std::_List_iterator<cmExpandedCommandArgument>::_List_iterator(&local_48);
    while( true ) {
      local_50._M_node =
           (_List_node_base *)
           std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
           ::end(newArgs);
      bVar1 = std::operator!=(&argP1,&local_50);
      if (!bVar1) break;
      argP2 = argP1;
      IncrementArguments(this,newArgs,&argP2,&local_48);
      local_58._M_node =
           (_List_node_base *)
           std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
           ::end(newArgs);
      bVar1 = std::operator!=(&argP2,&local_58);
      local_79 = false;
      if (bVar1) {
        pcVar2 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP2);
        bVar1 = IsKeyword(this,&keyAND_abi_cxx11_,pcVar2);
        local_79 = false;
        if (bVar1) {
          local_60._M_node =
               (_List_node_base *)
               std::__cxx11::
               list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::end
                         (newArgs);
          local_79 = std::operator!=(&local_48,&local_60);
        }
      }
      if (local_79 != false) {
        pcVar2 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP1);
        arg._M_node._3_1_ = GetBooleanValueWithAutoDereference(this,pcVar2,errorString,status,false)
        ;
        pcVar2 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&local_48);
        arg._M_node._2_1_ = GetBooleanValueWithAutoDereference(this,pcVar2,errorString,status,false)
        ;
        local_7a = false;
        if ((arg._M_node._3_1_ & 1) != 0) {
          local_7a = (bool)arg._M_node._2_1_;
        }
        HandleBinaryOp(this,local_7a,(int *)((long)&arg._M_node + 4),&argP1,newArgs,&argP2,&local_48
                      );
      }
      local_68._M_node =
           (_List_node_base *)
           std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
           ::end(newArgs);
      bVar1 = std::operator!=(&argP2,&local_68);
      local_7b = false;
      if (bVar1) {
        pcVar2 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP2);
        bVar1 = IsKeyword(this,&keyOR_abi_cxx11_,pcVar2);
        local_7b = false;
        if (bVar1) {
          local_70._M_node =
               (_List_node_base *)
               std::__cxx11::
               list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::end
                         (newArgs);
          local_7b = std::operator!=(&local_48,&local_70);
        }
      }
      if (local_7b != false) {
        pcVar2 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP1);
        arg._M_node._3_1_ = GetBooleanValueWithAutoDereference(this,pcVar2,errorString,status,false)
        ;
        pcVar2 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&local_48);
        arg._M_node._2_1_ = GetBooleanValueWithAutoDereference(this,pcVar2,errorString,status,false)
        ;
        local_7c = true;
        if ((arg._M_node._3_1_ & 1) == 0) {
          local_7c = (bool)arg._M_node._2_1_;
        }
        HandleBinaryOp(this,local_7c,(int *)((long)&arg._M_node + 4),&argP1,newArgs,&argP2,&local_48
                      );
      }
      std::_List_iterator<cmExpandedCommandArgument>::operator++(&argP1);
    }
  } while (arg._M_node._4_4_ != 0);
  return true;
}

Assistant:

bool cmConditionEvaluator::HandleLevel4(cmArgumentList& newArgs,
                                        std::string& errorString,
                                        cmake::MessageType& status)
{
  int reducible;
  bool lhs;
  bool rhs;
  do {
    reducible = 0;
    cmArgumentList::iterator arg = newArgs.begin();
    cmArgumentList::iterator argP1;
    cmArgumentList::iterator argP2;
    while (arg != newArgs.end()) {
      argP1 = arg;
      IncrementArguments(newArgs, argP1, argP2);
      if (argP1 != newArgs.end() && IsKeyword(keyAND, *argP1) &&
          argP2 != newArgs.end()) {
        lhs =
          this->GetBooleanValueWithAutoDereference(*arg, errorString, status);
        rhs = this->GetBooleanValueWithAutoDereference(*argP2, errorString,
                                                       status);
        this->HandleBinaryOp((lhs && rhs), reducible, arg, newArgs, argP1,
                             argP2);
      }

      if (argP1 != newArgs.end() && this->IsKeyword(keyOR, *argP1) &&
          argP2 != newArgs.end()) {
        lhs =
          this->GetBooleanValueWithAutoDereference(*arg, errorString, status);
        rhs = this->GetBooleanValueWithAutoDereference(*argP2, errorString,
                                                       status);
        this->HandleBinaryOp((lhs || rhs), reducible, arg, newArgs, argP1,
                             argP2);
      }
      ++arg;
    }
  } while (reducible);
  return true;
}